

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char *string;
  char cVar2;
  _Bool _Var3;
  CURLcode CVar4;
  long *plVar5;
  undefined1 uVar6;
  Curl_handler *pCVar7;
  long lVar8;
  char *pcVar9;
  
  pCVar1 = conn->data;
  if (((conn->bits).httpproxy == true) && ((pCVar1->set).tunnel_thru_httpproxy == false)) {
    pCVar7 = &Curl_handler_ftps_proxy;
    if (conn->handler == &Curl_handler_ftp) {
      pCVar7 = &Curl_handler_ftp_proxy;
    }
    conn->handler = pCVar7;
    CVar4 = Curl_http_setup_conn(conn);
    return CVar4;
  }
  plVar5 = (long *)(*Curl_cmalloc)(0x28);
  (conn->data->req).protop = plVar5;
  if (plVar5 != (long *)0x0) {
    pcVar9 = (pCVar1->state).path + 1;
    (pCVar1->state).path = pcVar9;
    (pCVar1->state).slash_removed = true;
    pcVar9 = strstr(pcVar9,";type=");
    if ((pcVar9 != (char *)0x0) ||
       (pcVar9 = strstr((conn->host).rawalloc,";type="), pcVar9 != (char *)0x0)) {
      *pcVar9 = '\0';
      cVar2 = Curl_raw_toupper(pcVar9[6]);
      (conn->bits).type_set = true;
      uVar6 = 1;
      lVar8 = 0x5cb;
      if (cVar2 != 'A') {
        if (cVar2 == 'D') {
          lVar8 = 0x5cd;
        }
        else {
          uVar6 = 0;
        }
      }
      *(undefined1 *)((long)pCVar1->sockets + lVar8 + -0x80) = uVar6;
    }
    *plVar5 = (long)&(conn->data->req).bytecount;
    *(undefined4 *)(plVar5 + 3) = 0;
    plVar5[4] = 0;
    pcVar9 = conn->user;
    plVar5[1] = (long)pcVar9;
    string = conn->passwd;
    plVar5[2] = (long)string;
    _Var3 = isBadFtpString(pcVar9);
    CVar4 = CURLE_URL_MALFORMAT;
    if ((!_Var3) && (_Var3 = isBadFtpString(string), !_Var3)) {
      (conn->proto).ftpc.known_filesize = -1;
      CVar4 = CURLE_OK;
    }
    return CVar4;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  char command;
  struct FTP *ftp;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel ftp operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_ftp)
      conn->handler = &Curl_handler_ftp_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_ftps_proxy;
#else
      failf(data, "FTPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }
    /* set it up as a HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "FTP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  conn->data->req.protop = ftp = malloc(sizeof(struct FTP));
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  data->state.path++;   /* don't include the initial slash */
  data->state.slash_removed = TRUE; /* we've skipped the slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->bytecountp = &conn->data->req.bytecount;
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}